

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Clear(BaseDictionary<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *this)

{
  DictionaryStats *pDVar1;
  
  if (0 < this->count) {
    memset((this->buckets).ptr,0xff,(ulong)this->bucketCount << 2);
    memset((this->entries).ptr,0,(long)this->size * 0x38);
    this->count = 0;
    this->freeCount = 0;
    pDVar1 = DictionaryStats::Create
                       ("PN6JsUtil14BaseDictionaryIN2Js21EvalMapStringInternalILb0EEEPNS1_12FunctionInfoEN6Memory24RecyclerNonLeafAllocatorE20DictionarySizePolicyI11PrimePolicyLj2ELj2ELj1ELj4EE15DefaultComparerNS_21SimpleDictionaryEntryENS_12NoResizeLockEEE"
                        ,this->size);
    this->stats = pDVar1;
  }
  return;
}

Assistant:

void Clear()
        {
            if (count > 0)
            {
                memset(buckets, -1, bucketCount * sizeof(buckets[0]));
                memset(entries, 0, sizeof(EntryType) * size);
                count = 0;
                freeCount = 0;
#if PROFILE_DICTIONARY
                // To not loose previously collected data, we will treat cleared dictionary as a separate instance for stats tracking purpose
                stats = DictionaryStats::Create(typeid(this).name(), size);
#endif
            }
        }